

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O0

uint Kit_TruthIsop5_rec(uint uOn,uint uOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  int local_b8;
  int local_b4;
  int Var;
  int k;
  int i;
  uint uRes2;
  uint uRes1;
  uint uRes0;
  uint uOnDc1;
  uint uOnDc0;
  uint uOn1;
  uint uOn0;
  Kit_Sop_t *pcRes2;
  Kit_Sop_t *pcRes1;
  Kit_Sop_t *pcRes0;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  uint uMasks [5];
  Vec_Int_t *vStore_local;
  Kit_Sop_t *pcRes_local;
  int nVars_local;
  uint uOnDc_local;
  uint uOn_local;
  
  pcRes1 = (Kit_Sop_t *)&cRes1.pCubes;
  pcRes2 = (Kit_Sop_t *)&cRes2.pCubes;
  _uOn1 = (Kit_Sop_t *)&pcRes0;
  pcRes_local._0_4_ = nVars;
  pcRes_local._4_4_ = uOnDc;
  nVars_local = uOn;
  if (5 < nVars) {
    __assert_fail("nVars <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x166,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if ((uOn & (uOnDc ^ 0xffffffff)) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x167,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (uOn == 0) {
    pcRes->nLits = 0;
    pcRes->nCubes = 0;
    pcRes->pCubes = (uint *)0x0;
    uOnDc_local = 0;
  }
  else if (uOnDc == 0xffffffff) {
    pcRes->nLits = 0;
    pcRes->nCubes = 1;
    puVar5 = Vec_IntFetch(vStore,1);
    pcRes->pCubes = puVar5;
    if (pcRes->pCubes == (uint *)0x0) {
      pcRes->nCubes = -1;
      uOnDc_local = 0;
    }
    else {
      *pcRes->pCubes = 0;
      uOnDc_local = 0xffffffff;
    }
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x17c,
                    "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    local_b8 = nVars + -1;
    while (((-1 < local_b8 &&
            (iVar1 = Kit_TruthVarInSupport((uint *)&nVars_local,5,local_b8), iVar1 == 0)) &&
           (iVar1 = Kit_TruthVarInSupport((uint *)((long)&pcRes_local + 4),5,local_b8), iVar1 == 0))
          ) {
      local_b8 = local_b8 + -1;
    }
    if (local_b8 < 0) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x182,
                    "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    uOnDc1 = nVars_local;
    uOnDc0 = nVars_local;
    uRes1 = pcRes_local._4_4_;
    uRes0 = pcRes_local._4_4_;
    Kit_TruthCofactor0(&uOnDc0,local_b8 + 1,local_b8);
    Kit_TruthCofactor1(&uOnDc1,local_b8 + 1,local_b8);
    Kit_TruthCofactor0(&uRes0,local_b8 + 1,local_b8);
    Kit_TruthCofactor1(&uRes1,local_b8 + 1,local_b8);
    uVar2 = Kit_TruthIsop5_rec(uOnDc0 & (uRes1 ^ 0xffffffff),uRes0,local_b8,pcRes1,vStore);
    if (pcRes1->nCubes == -1) {
      pcRes->nCubes = -1;
      uOnDc_local = 0;
    }
    else {
      uVar3 = Kit_TruthIsop5_rec(uOnDc1 & (uRes0 ^ 0xffffffff),uRes1,local_b8,pcRes2,vStore);
      if (pcRes2->nCubes == -1) {
        pcRes->nCubes = -1;
        uOnDc_local = 0;
      }
      else {
        uVar4 = Kit_TruthIsop5_rec(uOnDc0 & (uVar2 ^ 0xffffffff) | uOnDc1 & (uVar3 ^ 0xffffffff),
                                   uRes0 & uRes1,local_b8,_uOn1,vStore);
        if (_uOn1->nCubes == -1) {
          pcRes->nCubes = -1;
          uOnDc_local = 0;
        }
        else {
          pcRes->nLits = pcRes1->nLits + pcRes2->nLits + _uOn1->nLits + pcRes1->nCubes +
                         pcRes2->nCubes;
          pcRes->nCubes = pcRes1->nCubes + pcRes2->nCubes + _uOn1->nCubes;
          puVar5 = Vec_IntFetch(vStore,pcRes->nCubes);
          pcRes->pCubes = puVar5;
          if (pcRes->pCubes == (uint *)0x0) {
            pcRes->nCubes = -1;
            uOnDc_local = 0;
          }
          else {
            local_b4 = 0;
            for (Var = 0; Var < pcRes1->nCubes; Var = Var + 1) {
              pcRes->pCubes[local_b4] = pcRes1->pCubes[Var] | 1 << ((byte)(local_b8 << 1) & 0x1f);
              local_b4 = local_b4 + 1;
            }
            for (Var = 0; Var < pcRes2->nCubes; Var = Var + 1) {
              pcRes->pCubes[local_b4] =
                   pcRes2->pCubes[Var] | 1 << ((char)(local_b8 << 1) + 1U & 0x1f);
              local_b4 = local_b4 + 1;
            }
            for (Var = 0; Var < _uOn1->nCubes; Var = Var + 1) {
              pcRes->pCubes[local_b4] = _uOn1->pCubes[Var];
              local_b4 = local_b4 + 1;
            }
            if (local_b4 != pcRes->nCubes) {
              __assert_fail("k == pcRes->nCubes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                            ,0x1ad,
                            "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                           );
            }
            uOnDc_local = uVar2 & (uMasks[(long)local_b8 + -2] ^ 0xffffffff) |
                          uVar3 & uMasks[(long)local_b8 + -2] | uVar4;
          }
        }
      }
    }
  }
  return uOnDc_local;
}

Assistant:

unsigned Kit_TruthIsop5_rec( unsigned uOn, unsigned uOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int i, k, Var;
    assert( nVars <= 5 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        return 0;
    }
    if ( uOnDc == 0xFFFFFFFF )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return 0;
        }
        pcRes->pCubes[0] = 0;
        return 0xFFFFFFFF;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( &uOn, 5, Var ) || 
             Kit_TruthVarInSupport( &uOnDc, 5, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = uOn1   = uOn;
    uOnDc0 = uOnDc1 = uOnDc;
    Kit_TruthCofactor0( &uOn0, Var + 1, Var );
    Kit_TruthCofactor1( &uOn1, Var + 1, Var );
    Kit_TruthCofactor0( &uOnDc0, Var + 1, Var );
    Kit_TruthCofactor1( &uOnDc1, Var + 1, Var );
    // solve for cofactors
    uRes0 = Kit_TruthIsop5_rec( uOn0 & ~uOnDc1, uOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes1 = Kit_TruthIsop5_rec( uOn1 & ~uOnDc0, uOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes2 = Kit_TruthIsop5_rec( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & ~uMasks[Var]) | (uRes1 & uMasks[Var]);
//    assert( (uOn & ~uRes2) == 0 );
//    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}